

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# config.cpp
# Opt level: O3

optional_ptr<const_duckdb::ConfigurationOption,_true>
duckdb::DBConfig::GetOptionByName(string *name)

{
  ConfigurationOption *pCVar1;
  int iVar2;
  undefined1 *puVar3;
  string lname;
  string local_30;
  
  StringUtil::Lower(&local_30,(string *)name);
  puVar3 = internal_options;
  do {
    iVar2 = ::std::__cxx11::string::compare((char *)&local_30);
    if (iVar2 == 0) goto LAB_016530b2;
    pCVar1 = (ConfigurationOption *)((long)puVar3 + 0x40);
    puVar3 = (undefined1 *)((long)puVar3 + 0x40);
  } while (pCVar1->name != (char *)0x0);
  puVar3 = (undefined1 *)0x0;
LAB_016530b2:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_30._M_dataplus._M_p != &local_30.field_2) {
    operator_delete(local_30._M_dataplus._M_p);
  }
  return (optional_ptr<const_duckdb::ConfigurationOption,_true>)(ConfigurationOption *)puVar3;
}

Assistant:

optional_ptr<const ConfigurationOption> DBConfig::GetOptionByName(const string &name) {
	auto lname = StringUtil::Lower(name);
	for (idx_t index = 0; internal_options[index].name; index++) {
		D_ASSERT(StringUtil::Lower(internal_options[index].name) == string(internal_options[index].name));
		if (internal_options[index].name == lname) {
			return internal_options + index;
		}
	}
	return nullptr;
}